

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.c
# Opt level: O0

double UnifReal(double dLow,double dHigh,long nStream)

{
  long lVar1;
  long in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double dTemp;
  long local_20;
  double local_18;
  double local_10;
  double local_8;
  
  if ((in_RDI < 0) || (local_20 = in_RDI, 0x31 < in_RDI)) {
    local_20 = 0;
  }
  if ((in_XMM0_Qa != in_XMM1_Qa) || (local_8 = in_XMM0_Qa, NAN(in_XMM0_Qa) || NAN(in_XMM1_Qa))) {
    local_18 = in_XMM1_Qa;
    local_10 = in_XMM0_Qa;
    if (in_XMM1_Qa < in_XMM0_Qa) {
      local_18 = in_XMM0_Qa;
      local_10 = in_XMM1_Qa;
    }
    lVar1 = NextRand(Seed[local_20].value);
    Seed[local_20].value = lVar1;
    local_8 = local_10 + ((double)Seed[local_20].value / dM) * (local_18 - local_10);
  }
  return local_8;
}

Assistant:

double
UnifReal(double dLow, double dHigh, long nStream)

/*
 * Returns a double uniformly distributed between dLow and dHigh,   
 * excluding the endpoints.  nStream is the random number stream.   
 * Stream 0 is used if nStream is not in the range 0..MAX_STREAM.
 */

{
    double          dTemp;

    if (nStream < 0 || nStream > MAX_STREAM)
        nStream = 0;
    if (dLow == dHigh)
        return (dLow);
    if (dLow > dHigh)
    {
        dTemp = dLow;
        dLow = dHigh;
        dHigh = dTemp;
    }
    Seed[nStream].value = NextRand(Seed[nStream].value);
    dTemp = ((double) Seed[nStream].value / dM) * (dHigh - dLow);
    return (dLow + dTemp);
}